

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  int nData;
  i64 iStart;
  MergeEngine *pMVar1;
  PmaReader *pPVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  u64 v;
  int dummy;
  PmaWriter writer;
  int local_64;
  PmaWriter local_60;
  
  iStart = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  vdbePmaWriterInit(pIncr->aFile[1].pFd,&local_60,pIncr->pTask->pSorter->pgsz,iStart);
  iVar4 = 0;
  while (iVar4 == 0) {
    pPVar2 = pMVar1->aReadr;
    iVar5 = pMVar1->aTree[1];
    if (pPVar2[iVar5].pFd == (sqlite3_file *)0x0) break;
    nData = pPVar2[iVar5].nKey;
    v = (u64)nData;
    lVar6 = (long)local_60.iBufEnd;
    lVar7 = local_60.iWriteOff + v;
    iVar3 = sqlite3VarintLen(v);
    if (pIncr->mxSz + iStart < (long)iVar3 + lVar7 + lVar6) break;
    vdbePmaWriteVarint(&local_60,v);
    vdbePmaWriteBlob(&local_60,pPVar2[iVar5].aKey,nData);
    iVar4 = vdbeMergeEngineStep(pIncr->pMerger,&local_64);
  }
  iVar5 = vdbePmaWriterFinish(&local_60,&pIncr->aFile[1].iEof);
  if (iVar4 != 0) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}